

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawCmd_resizeT(ImVector_ImDrawCmd *self,int new_size,ImDrawCmd v)

{
  int new_size_local;
  ImVector_ImDrawCmd *self_local;
  
  ImVector<ImDrawCmd>::resize(self,new_size,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawCmd_resizeT(ImVector_ImDrawCmd* self,int new_size,const ImDrawCmd v)
{
    return self->resize(new_size,v);
}